

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O2

Node * __thiscall
Parser::createImportVarDeclarationNode
          (Parser *this,vector<Node_*,_std::allocator<Node_*>_> *var_keys)

{
  pointer ppNVar1;
  Node *this_00;
  Node *this_01;
  ulong uVar2;
  long lVar3;
  Node *declarator;
  
  this_00 = (Node *)operator_new(0x30);
  Node::Node(this_00,this->ctx,&emptyToken);
  this_00->nodeType = PNT_IMPORT_VAR_DECLARATION;
  lVar3 = 0;
  for (uVar2 = 0;
      ppNVar1 = (var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3);
      uVar2 = uVar2 + 1) {
    this_01 = (Node *)operator_new(0x30);
    Node::Node(this_01,this->ctx,*(Token **)(*(long *)((long)ppNVar1 + lVar3) + 8));
    this_01->nodeType = PNT_VAR_DECLARATOR;
    declarator = this_01;
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              (&this_01->children,
               (value_type *)
               ((long)(var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                      super__Vector_impl_data._M_start + lVar3));
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&this_00->children,&declarator);
    lVar3 = lVar3 + 8;
  }
  return this_00;
}

Assistant:

Node * createImportVarDeclarationNode(vector<Node *> var_keys)
  {
    Node * n = new Node(ctx, emptyToken);
    n->nodeType = PNT_IMPORT_VAR_DECLARATION;

    for (size_t i = 0; i < var_keys.size(); i++)
    {
      Node * declarator = new Node(ctx, var_keys[i]->tok);
      declarator->nodeType = PNT_VAR_DECLARATOR;
      declarator->children.push_back(var_keys[i]);
      n->children.push_back(declarator);
    }

    return n;
  }